

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashid.h
# Opt level: O0

void hashid_init(hashid *hi,int max)

{
  hashid_node *phVar1;
  hashid_node **pphVar2;
  int local_1c;
  int local_18;
  int hashcap;
  int i;
  int max_local;
  hashid *hi_local;
  
  for (local_1c = 0x10; local_1c < max; local_1c = local_1c << 1) {
  }
  hi->hashmod = local_1c + -1;
  hi->cap = max;
  hi->count = 0;
  phVar1 = (hashid_node *)malloc((long)max << 4);
  hi->id = phVar1;
  for (local_18 = 0; local_18 < max; local_18 = local_18 + 1) {
    hi->id[local_18].id = -1;
    hi->id[local_18].next = (hashid_node *)0x0;
  }
  pphVar2 = (hashid_node **)malloc((long)local_1c << 3);
  hi->hash = pphVar2;
  memset(hi->hash,0,(long)local_1c << 3);
  return;
}

Assistant:

static void
hashid_init(struct hashid *hi, int max) {
	int i;
	int hashcap;
	hashcap = 16;
	while (hashcap < max) {
		hashcap *= 2;
	}
	hi->hashmod = hashcap - 1;
	hi->cap = max;
	hi->count = 0;
	hi->id = skynet_malloc(max * sizeof(struct hashid_node));
	for (i=0;i<max;i++) {
		hi->id[i].id = -1;
		hi->id[i].next = NULL;
	}
	hi->hash = skynet_malloc(hashcap * sizeof(struct hashid_node *));
	memset(hi->hash, 0, hashcap * sizeof(struct hashid_node *));
}